

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

void __thiscall
despot::MemoryPool<despot::TigerState>::Free(MemoryPool<despot::TigerState> *this,TigerState *obj)

{
  TigerState *obj_local;
  
  obj_local = obj;
  if (obj->field_0x8 != '\0') {
    obj->field_0x8 = 0;
    std::vector<despot::TigerState_*,_std::allocator<despot::TigerState_*>_>::push_back
              (&this->freelist_,&obj_local);
    this->num_allocated_ = this->num_allocated_ + -1;
    return;
  }
  __assert_fail("obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x3b,
                "void despot::MemoryPool<despot::TigerState>::Free(T *) [T = despot::TigerState]");
}

Assistant:

void Free(T* obj) {
		assert(obj->IsAllocated());
		obj->ClearAllocated();
		freelist_.push_back(obj);
		num_allocated_--;
	}